

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_benchmark.c
# Opt level: O3

void run_test(uint32_t spanlen,uint32_t intvlen,double density,order_t order)

{
  uint32_t uVar1;
  double dVar2;
  undefined1 *puVar3;
  size_t i;
  roaring_bitmap_t *prVar4;
  long lVar5;
  double dVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  double *pdVar11;
  undefined4 in_register_0000003c;
  uint32_t *puVar12;
  int p_1;
  ulong uVar13;
  int p;
  uint32_t *puVar14;
  undefined1 *puVar15;
  ulong uVar16;
  long lVar17;
  double *pdVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double local_108 [5];
  undefined8 uStack_e0;
  undefined1 auStack_d8 [8];
  uint32_t *local_d0;
  uint32_t *offsets;
  timespec ts_5;
  long lStack_b0;
  uint local_a4;
  ulong uStack_a0;
  uint32_t count;
  undefined1 *local_98;
  undefined8 local_90;
  double local_88;
  double local_80;
  double *local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 *local_60;
  double local_58;
  ulong local_50;
  undefined1 auStack_48 [8];
  timespec ts;
  
  local_90 = CONCAT44(in_register_0000003c,spanlen);
  uVar13 = (ulong)intvlen;
  if (order == ASC) {
    pcVar8 = "ASC";
  }
  else if (order == DESC) {
    pcVar8 = "DESC";
  }
  else {
    pcVar8 = "???";
    if (order == SHUFFLE) {
      pcVar8 = "SHUFFLE";
    }
  }
  uStack_e0 = 0x10154d;
  local_58 = density;
  printf("intvlen=%u density=%f order=%s\n",uVar13,pcVar8);
  uStack_e0 = 0x101577;
  make_data((uint32_t)local_90,intvlen,local_58,order,&local_d0,&local_a4);
  lVar17 = 0;
  local_98 = auStack_d8;
  local_78 = local_108;
  printf("  roaring_bitmap_add():");
  local_50 = (ulong)local_a4;
  local_88 = (double)local_50;
  local_80 = (double)uVar13;
  local_58 = (double)uVar13;
  do {
    local_68 = lVar17;
    prVar4 = roaring_bitmap_create_with_capacity(0);
    clock_gettime(3,(timespec *)auStack_48);
    local_70 = (undefined1 *)auStack_48;
    local_60 = (undefined1 *)ts.tv_sec;
    if (local_50 != 0) {
      uVar16 = 0;
      dVar6 = local_58;
      do {
        if (SUB84(dVar6,0) != 0) {
          iVar10 = 0;
          do {
            roaring_bitmap_add(prVar4,local_d0[uVar16] + iVar10);
            iVar10 = iVar10 + 1;
            dVar6 = local_58;
          } while (SUB84(local_58,0) != iVar10);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != local_50);
    }
    clock_gettime(3,(timespec *)auStack_48);
    lVar17 = local_68;
    lVar5 = ((long)auStack_48 - (long)local_70) * 1000000000 + (ts.tv_sec - (long)local_60);
    auVar19._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar19._0_8_ = lVar5;
    auVar19._12_4_ = 0x45300000;
    local_78[local_68] =
         (((auVar19._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / local_88) / local_80;
    roaring_bitmap_free(prVar4);
    pdVar18 = local_78;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 5);
  lVar17 = 1;
  dVar6 = *local_78;
  do {
    dVar2 = local_78[lVar17];
    if (dVar6 <= local_78[lVar17]) {
      dVar2 = dVar6;
    }
    lVar17 = lVar17 + 1;
    dVar6 = dVar2;
  } while (lVar17 != 5);
  printf("          %6.1f\n");
  puVar15 = (undefined1 *)0x0;
  printf("  roaring_bitmap_add_many():");
  local_68 = uVar13 * 4;
  uStack_a0 = (ulong)(uint)((int)local_50 * local_58._0_4_) * 4 + 0xf & 0xfffffffffffffff0;
  pdVar11 = local_108;
  do {
    local_60 = puVar15;
    pdVar11[-1] = 5.20988271014428e-318;
    prVar4 = roaring_bitmap_create_with_capacity(0);
    dVar6 = local_58;
    lVar17 = local_68;
    puVar14 = (uint32_t *)((long)pdVar11 - uStack_a0);
    local_70 = (undefined1 *)pdVar11;
    if (local_50 == 0) {
      puVar14[-2] = 0x1017cf;
      puVar14[-1] = 0;
      clock_gettime(3,(timespec *)auStack_48);
      ts_5.tv_nsec = (__syscall_slong_t)auStack_48;
      lStack_b0 = ts.tv_sec;
    }
    else {
      uVar16 = 0;
      puVar12 = puVar14;
      do {
        if (SUB84(dVar6,0) != 0) {
          uVar9 = 0;
          do {
            puVar12[uVar9] = local_d0[uVar16] + (int)uVar9;
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
        }
        uVar16 = uVar16 + 1;
        puVar12 = (uint32_t *)((long)puVar12 + lVar17);
      } while (uVar16 != local_50);
      puVar14[-2] = 0x10177a;
      puVar14[-1] = 0;
      clock_gettime(3,(timespec *)auStack_48);
      lStack_b0 = ts.tv_sec;
      puVar12 = puVar14;
      ts_5.tv_nsec = (__syscall_slong_t)auStack_48;
      pdVar18 = local_78;
      for (uVar16 = local_50; local_78 = pdVar18, uVar16 != 0; uVar16 = uVar16 - 1) {
        puVar14[-2] = 0x1017a1;
        puVar14[-1] = 0;
        roaring_bitmap_add_many(prVar4,uVar13,puVar12);
        puVar12 = (uint32_t *)((long)puVar12 + local_68);
        pdVar18 = local_78;
      }
    }
    puVar15 = local_60;
    puVar14[-2] = 0x1017ed;
    puVar14[-1] = 0;
    clock_gettime(3,(timespec *)auStack_48);
    lVar17 = (ts.tv_sec - lStack_b0) + ((long)auStack_48 - ts_5.tv_nsec) * 1000000000;
    auVar20._8_4_ = (int)((ulong)lVar17 >> 0x20);
    auVar20._0_8_ = lVar17;
    auVar20._12_4_ = 0x45300000;
    pdVar18[(long)puVar15] =
         (((auVar20._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) / local_88) / local_80;
    puVar14[-2] = 0x10184c;
    puVar14[-1] = 0;
    roaring_bitmap_free(prVar4);
    puVar3 = local_70;
    puVar15 = puVar15 + 1;
    pdVar11 = (double *)local_70;
  } while (puVar15 != (undefined1 *)0x5);
  lVar17 = 1;
  dVar6 = *pdVar18;
  do {
    dVar2 = pdVar18[lVar17];
    if (dVar6 <= pdVar18[lVar17]) {
      dVar2 = dVar6;
    }
    lVar17 = lVar17 + 1;
    dVar6 = dVar2;
  } while (lVar17 != 5);
  *(undefined8 *)(local_70 + -8) = 0x10188c;
  printf("     %6.1f\n");
  lVar17 = 0;
  *(undefined8 *)(puVar3 + -8) = 0x10189d;
  printf("  roaring_bitmap_add_bulk():");
  do {
    local_68 = lVar17;
    *(undefined8 *)(puVar3 + -8) = 0x1018ac;
    prVar4 = roaring_bitmap_create_with_capacity(0);
    *(undefined8 *)(puVar3 + -8) = 0x1018bc;
    clock_gettime(3,(timespec *)auStack_48);
    local_70 = (undefined1 *)auStack_48;
    local_60 = (undefined1 *)ts.tv_sec;
    auStack_48 = (undefined1  [8])0x0;
    ts.tv_sec = 0;
    if (local_50 != 0) {
      uVar13 = 0;
      dVar6 = local_58;
      do {
        if (SUB84(dVar6,0) != 0) {
          iVar10 = 0;
          do {
            uVar1 = local_d0[uVar13];
            *(undefined8 *)(puVar3 + -8) = 0x1018fa;
            roaring_bitmap_add_bulk(prVar4,(roaring_bulk_context_t *)auStack_48,uVar1 + iVar10);
            iVar10 = iVar10 + 1;
            dVar6 = local_58;
          } while (SUB84(local_58,0) != iVar10);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != local_50);
    }
    *(undefined8 *)(puVar3 + -8) = 0x10191e;
    clock_gettime(3,(timespec *)&offsets);
    lVar17 = local_68;
    pdVar18 = local_78;
    lVar5 = ((long)offsets - (long)local_70) * 1000000000 + (ts_5.tv_sec - (long)local_60);
    auVar21._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar21._0_8_ = lVar5;
    auVar21._12_4_ = 0x45300000;
    local_78[local_68] =
         (((auVar21._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / local_88) / local_80;
    *(undefined8 *)(puVar3 + -8) = 0x10197f;
    roaring_bitmap_free(prVar4);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 5);
  lVar17 = 1;
  dVar6 = *pdVar18;
  do {
    dVar2 = pdVar18[lVar17];
    if (dVar6 <= pdVar18[lVar17]) {
      dVar2 = dVar6;
    }
    lVar17 = lVar17 + 1;
    dVar6 = dVar2;
  } while (lVar17 != 5);
  *(undefined8 *)(puVar3 + -8) = 0x1019b9;
  printf("     %6.1f\n");
  lVar17 = 0;
  *(undefined8 *)(puVar3 + -8) = 0x1019ca;
  printf("  roaring_bitmap_add_range():");
  do {
    *(undefined8 *)(puVar3 + -8) = 0x1019d5;
    prVar4 = roaring_bitmap_create_with_capacity(0);
    *(undefined8 *)(puVar3 + -8) = 0x1019e5;
    clock_gettime(3,(timespec *)auStack_48);
    local_60 = (undefined1 *)auStack_48;
    local_68 = ts.tv_sec;
    if (local_50 != 0) {
      uVar13 = 0;
      dVar6 = local_58;
      do {
        uVar1 = local_d0[uVar13];
        uVar7 = uVar1 + SUB84(dVar6,0);
        if (uVar1 < uVar7) {
          *(undefined8 *)(puVar3 + -8) = 0x101a18;
          roaring_bitmap_add_range_closed(prVar4,uVar1,uVar7 - 1);
          dVar6 = local_58;
        }
        uVar13 = uVar13 + 1;
      } while (local_50 != uVar13);
    }
    *(undefined8 *)(puVar3 + -8) = 0x101a36;
    clock_gettime(3,(timespec *)auStack_48);
    lVar5 = ((long)auStack_48 - (long)local_60) * 1000000000 + (ts.tv_sec - local_68);
    auVar22._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar22._0_8_ = lVar5;
    auVar22._12_4_ = 0x45300000;
    pdVar18[lVar17] =
         (((auVar22._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / local_88) / local_80;
    *(undefined8 *)(puVar3 + -8) = 0x101a89;
    roaring_bitmap_free(prVar4);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 5);
  lVar17 = 1;
  dVar6 = *pdVar18;
  do {
    dVar2 = pdVar18[lVar17];
    if (dVar6 <= pdVar18[lVar17]) {
      dVar2 = dVar6;
    }
    lVar17 = lVar17 + 1;
    dVar6 = dVar2;
  } while (lVar17 != 5);
  *(undefined8 *)(puVar3 + -8) = 0x101ac3;
  printf("    %6.1f\n");
  lVar17 = 0;
  *(undefined8 *)(puVar3 + -8) = 0x101ad4;
  printf("  roaring_bitmap_remove():");
  local_70 = (undefined1 *)CONCAT44(local_70._4_4_,(int)local_90 + -1);
  do {
    *(undefined8 *)(puVar3 + -8) = 0x101aeb;
    prVar4 = roaring_bitmap_create_with_capacity(0);
    if ((int)local_90 != 0) {
      uVar1 = (uint32_t)local_70;
      *(undefined8 *)(puVar3 + -8) = 0x101b04;
      roaring_bitmap_add_range_closed(prVar4,0,uVar1);
    }
    *(undefined8 *)(puVar3 + -8) = 0x101b11;
    clock_gettime(3,(timespec *)auStack_48);
    local_60 = (undefined1 *)auStack_48;
    local_68 = ts.tv_sec;
    if (local_50 != 0) {
      uVar13 = 0;
      dVar6 = local_58;
      do {
        if (SUB84(dVar6,0) != 0) {
          iVar10 = 0;
          do {
            uVar1 = local_d0[uVar13];
            *(undefined8 *)(puVar3 + -8) = 0x101b43;
            roaring_bitmap_remove(prVar4,uVar1 + iVar10);
            iVar10 = iVar10 + 1;
            dVar6 = local_58;
          } while (SUB84(local_58,0) != iVar10);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != local_50);
    }
    *(undefined8 *)(puVar3 + -8) = 0x101b67;
    clock_gettime(3,(timespec *)auStack_48);
    pdVar18 = local_78;
    lVar5 = ((long)auStack_48 - (long)local_60) * 1000000000 + (ts.tv_sec - local_68);
    auVar23._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar23._0_8_ = lVar5;
    auVar23._12_4_ = 0x45300000;
    local_78[lVar17] =
         (((auVar23._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / local_88) / local_80;
    *(undefined8 *)(puVar3 + -8) = 0x101bbe;
    roaring_bitmap_free(prVar4);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 5);
  lVar17 = 1;
  dVar6 = *pdVar18;
  do {
    dVar2 = pdVar18[lVar17];
    if (dVar6 <= pdVar18[lVar17]) {
      dVar2 = dVar6;
    }
    lVar17 = lVar17 + 1;
    dVar6 = dVar2;
  } while (lVar17 != 5);
  *(undefined8 *)(puVar3 + -8) = 0x101bf8;
  printf("       %6.1f\n");
  lVar17 = 0;
  *(undefined8 *)(puVar3 + -8) = 0x101c09;
  printf("  roaring_bitmap_remove_range():");
  do {
    *(undefined8 *)(puVar3 + -8) = 0x101c14;
    prVar4 = roaring_bitmap_create_with_capacity(0);
    if ((int)local_90 != 0) {
      uVar1 = (uint32_t)local_70;
      *(undefined8 *)(puVar3 + -8) = 0x101c2d;
      roaring_bitmap_add_range_closed(prVar4,0,uVar1);
    }
    *(undefined8 *)(puVar3 + -8) = 0x101c3a;
    clock_gettime(3,(timespec *)auStack_48);
    local_60 = (undefined1 *)auStack_48;
    local_68 = ts.tv_sec;
    if (local_50 != 0) {
      uVar13 = 0;
      dVar6 = local_58;
      do {
        uVar1 = local_d0[uVar13];
        uVar7 = uVar1 + SUB84(dVar6,0);
        if (uVar1 < uVar7) {
          *(undefined8 *)(puVar3 + -8) = 0x101c6d;
          roaring_bitmap_remove_range_closed(prVar4,uVar1,uVar7 - 1);
          dVar6 = local_58;
        }
        uVar13 = uVar13 + 1;
      } while (local_50 != uVar13);
    }
    *(undefined8 *)(puVar3 + -8) = 0x101c8b;
    clock_gettime(3,(timespec *)auStack_48);
    lVar5 = ((long)auStack_48 - (long)local_60) * 1000000000 + (ts.tv_sec - local_68);
    auVar24._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar24._0_8_ = lVar5;
    auVar24._12_4_ = 0x45300000;
    pdVar18[lVar17] =
         (((auVar24._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / local_88) / local_80;
    *(undefined8 *)(puVar3 + -8) = 0x101cde;
    roaring_bitmap_free(prVar4);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 5);
  lVar17 = 0;
  dVar6 = *pdVar18;
  do {
    dVar2 = pdVar18[lVar17 + 1];
    if (dVar6 <= pdVar18[lVar17 + 1]) {
      dVar2 = dVar6;
    }
    lVar17 = lVar17 + 1;
    dVar6 = dVar2;
  } while (lVar17 != 4);
  *(undefined8 *)(puVar3 + -8) = 0x101d16;
  printf(" %6.1f\n");
  *(undefined8 *)(puVar3 + -8) = 0x101d1e;
  free(local_d0);
  return;
}

Assistant:

void run_test(uint32_t spanlen, uint32_t intvlen, double density,
              order_t order) {
    printf("intvlen=%u density=%f order=%s\n", intvlen, density,
           (order == ASC
                ? "ASC"
                : (order == DESC ? "DESC"
                                 : (order == SHUFFLE ? "SHUFFLE" : "???"))));

    uint32_t *offsets;
    uint32_t count;
    make_data(spanlen, intvlen, density, order, &offsets, &count);
    const int num_passes = 5;
    uint64_t cycles_start, cycles_final;
    double results[num_passes];

    printf("  roaring_bitmap_add():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                roaring_bitmap_add(r, offsets[i] + j);
            }
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("          %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_add_many():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        uint32_t values[intvlen * count];
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                values[i * intvlen + j] = offsets[i] + j;
            }
        }
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            roaring_bitmap_add_many(r, intvlen, values + (i * intvlen));
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("     %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_add_bulk():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        RDTSC_START(cycles_start);
        roaring_bulk_context_t context = {0, 0, 0, 0};
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                roaring_bitmap_add_bulk(r, &context, offsets[i] + j);
            }
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("     %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_add_range():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            roaring_bitmap_add_range(r, offsets[i], offsets[i] + intvlen);
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("    %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_remove():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        roaring_bitmap_add_range(r, 0, spanlen);
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                roaring_bitmap_remove(r, offsets[i] + j);
            }
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("       %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_remove_range():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        roaring_bitmap_add_range(r, 0, spanlen);
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            roaring_bitmap_remove_range(r, offsets[i], offsets[i] + intvlen);
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf(" %6.1f\n", array_min(results, num_passes));

    free(offsets);
}